

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O1

void __thiscall Person::Person(Person *this,string *name,string *id,Address *address)

{
  pointer pcVar1;
  int iVar2;
  long *local_50 [2];
  long local_40 [2];
  
  this->_vptr_Person = (_func_int **)&PTR_validate_00109d98;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->address).country._M_dataplus._M_p = (pointer)&(this->address).country.field_2;
  (this->address).country._M_string_length = 0;
  (this->address).country.field_2._M_local_buf[0] = '\0';
  (this->address).city._M_dataplus._M_p = (pointer)&(this->address).city.field_2;
  (this->address).city._M_string_length = 0;
  (this->address).city.field_2._M_local_buf[0] = '\0';
  (this->address).street._M_dataplus._M_p = (pointer)&(this->address).street.field_2;
  (this->address).street._M_string_length = 0;
  (this->address).street.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->id);
  std::__cxx11::string::_M_assign((string *)&this->address);
  std::__cxx11::string::_M_assign((string *)&(this->address).city);
  std::__cxx11::string::_M_assign((string *)&(this->address).street);
  pcVar1 = (id->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar1,pcVar1 + id->_M_string_length)
  ;
  iVar2 = (**this->_vptr_Person)(this,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((char)iVar2 != '\0') {
    return;
  }
  std::operator<<((ostream *)&std::cout,"Invalid id");
  exit(1);
}

Assistant:

Person::Person(const string &name, const string &id, const Address &address) {
    this->name = name;
    this->id = id;
    this->address = address;
    if (!validate(id)) { // if the id was invalid exit the program
        cout << "Invalid id";
        exit(1);
    }
}